

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O3

FILE * wrapped_fopen(char *path,char *mode)

{
  int *piVar1;
  int fd;
  long lVar2;
  code *UNRECOVERED_JUMPTABLE;
  FILE *__stream;
  FILE *pFVar3;
  curious_metadata_record_t io_args;
  undefined8 local_48;
  char *pcStack_40;
  char *local_38;
  undefined8 uStack_30;
  
  lVar2 = __tls_get_addr(&PTR_00279768);
  piVar1 = (int *)(lVar2 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[0x16].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    local_38 = (char *)0x0;
    uStack_30 = 0x16;
    local_48 = 0;
    pcStack_40 = (char *)0x0;
    curious_get_filesystem(path,&pcStack_40,&local_38);
    curious_call_callbacks(4,&local_48);
    __stream = (FILE *)(*UNRECOVERED_JUMPTABLE)(path,mode);
    if (__stream != (FILE *)0x0) {
      fd = fileno(__stream);
      curious_register_file_by_fd(fd);
    }
    curious_call_callbacks(5,&local_48);
    *piVar1 = *piVar1 + -1;
    return (FILE *)__stream;
  }
  *piVar1 = *piVar1 + -1;
  pFVar3 = (FILE *)(*UNRECOVERED_JUMPTABLE)(path,mode);
  return pFVar3;
}

Assistant:

FILE* wrapped_fopen(const char* path, const char* mode)
{
    WRAPPER_ENTER(fopen);

    // Get the handle for the original function
    fopen_f orig_fopen = (fopen_f) gotcha_get_wrappee(io_fns[CURIOUS_FOPEN_ID].handle);

    if (1 == wrapper_call_depth && wrappers_enabled) {
        // NOTE: calling realpath on pathname before passing it to curious_get_filesystem
        //       might be necessary in order to handle relative paths_
        curious_metadata_record_t io_args = {
            .call_count  = 0,
            .function_id = CURIOUS_FOPEN_ID,
        };

        curious_get_filesystem(path, &io_args.filesystem, &io_args.mount_point);
        curious_call_callbacks(CURIOUS_METADATA_CALLBACK, &io_args);

        // Call the original, saving the result...
        FILE* file = orig_fopen(path, mode);

        if (NULL != file) {
            curious_register_file_by_fd(fileno(file));
        }

        curious_call_callbacks(CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);
        WRAPPER_RETURN(file, fopen);
    } else {
        WRAPPER_RETURN(orig_fopen(path, mode), fopen);
    }
}